

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O2

void __thiscall QuerySegment_Test1_Test::TestBody(QuerySegment_Test1_Test *this)

{
  pointer pbVar1;
  pointer pbVar2;
  char *pcVar3;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  AssertHelper local_1f0;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string s2;
  string s1;
  QuerySegment segment;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"../dict/jieba.dict.utf8",(allocator<char> *)local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s2,"../dict/hmm_model.utf8",(allocator<char> *)&words);
  pcVar3 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"",(allocator<char> *)&local_1f0);
  cppjieba::QuerySegment::QuerySegment(&segment,&s1,&s2,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s1._M_dataplus._M_p = (pointer)&s1.field_2;
  s1._M_string_length = 0;
  s1.field_2._M_local_buf[0] = '\0';
  s2._M_dataplus._M_p = (pointer)&s2.field_2;
  s2._M_string_length = 0;
  s2.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,anon_var_dwarf_88126,(allocator<char> *)local_1c8);
  cppjieba::QuerySegment::Cut(&segment,(string *)&gtest_ar,&words);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pbVar2 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"/",(allocator<char> *)&local_1f0);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)&gtest_ar,(limonp *)pbVar1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8
             ,in_R8);
  std::__cxx11::string::operator=((string *)&s1,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::assign((char *)&s2);
  pbVar4 = &s2;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"s1","s2",&s1,pbVar4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_1c8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
               ,0xcf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)local_1c8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,anon_var_dwarf_8817c,(allocator<char> *)local_1c8);
    cppjieba::QuerySegment::Cut(&segment,(string *)&gtest_ar,&words);
    std::__cxx11::string::~string((string *)&gtest_ar);
    pbVar2 = words.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar1 = words.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"/",(allocator<char> *)&local_1f0);
    limonp::
    Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((string *)&gtest_ar,(limonp *)pbVar1,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1c8,pbVar4);
    std::__cxx11::string::operator=((string *)&s1,(string *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::assign((char *)&s2);
    pbVar4 = &s2;
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,"s1","s2",&s1,pbVar4);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,anon_var_dwarf_88192,(allocator<char> *)local_1c8);
      cppjieba::QuerySegment::Cut(&segment,(string *)&gtest_ar,&words);
      std::__cxx11::string::~string((string *)&gtest_ar);
      pbVar2 = words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar1 = words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c8,"/",(allocator<char> *)&local_1f0);
      limonp::
      Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((string *)&gtest_ar,(limonp *)pbVar1,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1c8,pbVar4);
      std::__cxx11::string::operator=((string *)&s1,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::string::assign((char *)&s2);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar,"s1","s2",&s1,&s2);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)local_1c8);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                   ,0xd9,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1f0,(Message *)local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(local_1c8);
      }
      goto LAB_001569a4;
    }
    testing::Message::Message((Message *)local_1c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
               ,0xd4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)local_1c8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_1f0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_1c8);
LAB_001569a4:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  cppjieba::QuerySegment::~QuerySegment(&segment);
  return;
}

Assistant:

TEST(QuerySegment, Test1) {
  QuerySegment segment("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8", "");
  vector<string> words;
  string s1, s2;

  segment.Cut("小明硕士毕业于中国科学院计算所，后在日本京都大学深造", words);
  s1 = Join(words.begin(), words.end(), "/");
  s2 = "小明/硕士/毕业/于/中国/科学/学院/科学院/中国科学院/计算/计算所/，/后/在/日本/京都/大学/日本京都大学/深造";
  ASSERT_EQ(s1, s2);

  segment.Cut("亲口交代", words);
  s1 = Join(words.begin(), words.end(), "/");
  s2 = "亲口/交代";
  ASSERT_EQ(s1, s2);

  segment.Cut("他心理健康", words);
  s1 = Join(words.begin(), words.end(), "/");
  s2 = "他/心理/健康/心理健康";
  ASSERT_EQ(s1, s2);
}